

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_impl.h
# Opt level: O2

void __thiscall
google::protobuf::internal::ArenaImpl::SerialArena::AddCleanup
          (SerialArena *this,void *elem,_func_void_void_ptr *cleanup)

{
  CleanupNode *pCVar1;
  ulong uVar2;
  CleanupChunk *pCVar3;
  ulong uVar4;
  
  pCVar1 = this->cleanup_ptr_;
  if (pCVar1 == this->cleanup_limit_) {
    if (this->cleanup_ == (CleanupChunk *)0x0) {
      uVar4 = 8;
    }
    else {
      uVar2 = this->cleanup_->size * 2;
      uVar4 = 0x40;
      if (uVar2 < 0x40) {
        uVar4 = uVar2;
      }
    }
    pCVar3 = (CleanupChunk *)AllocateAligned(this,(ulong)((int)uVar4 * 0x10 + 0x17U & 0xff0));
    pCVar3->next = this->cleanup_;
    pCVar3->size = uVar4;
    this->cleanup_ = pCVar3;
    this->cleanup_ptr_ = pCVar3->nodes;
    this->cleanup_limit_ = pCVar3->nodes + uVar4;
    AddCleanup(this,elem,cleanup);
    return;
  }
  pCVar1->elem = elem;
  pCVar1->cleanup = cleanup;
  this->cleanup_ptr_ = pCVar1 + 1;
  return;
}

Assistant:

void AddCleanup(void* elem, void (*cleanup)(void*)) {
      if (PROTOBUF_PREDICT_FALSE(cleanup_ptr_ == cleanup_limit_)) {
        AddCleanupFallback(elem, cleanup);
        return;
      }
      cleanup_ptr_->elem = elem;
      cleanup_ptr_->cleanup = cleanup;
      cleanup_ptr_++;
    }